

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O1

void __thiscall wasm::ReReloop::IfTask::run(IfTask *this)

{
  ReReloop *pRVar1;
  Block *pBVar2;
  Block *Target;
  
  if (this->phase == 1) {
    pRVar1 = (this->super_Task).parent;
    pBVar2 = pRVar1->currCFGBlock;
    Target = startCFGBlock(pRVar1);
    CFG::Block::AddBranchTo(this->ifTrueEnd,Target,(Expression *)0x0,(Expression *)0x0);
    CFG::Block::AddBranchTo(pBVar2,Target,(Expression *)0x0,(Expression *)0x0);
    return;
  }
  if (this->phase == 0) {
    pRVar1 = (this->super_Task).parent;
    this->ifTrueEnd = pRVar1->currCFGBlock;
    pBVar2 = startCFGBlock(pRVar1);
    CFG::Block::AddBranchTo(this->condition,pBVar2,(Expression *)0x0,(Expression *)0x0);
    if (this->curr->ifFalse == (Expression *)0x0) {
      CFG::Block::AddBranchTo(this->ifTrueEnd,pBVar2,(Expression *)0x0,(Expression *)0x0);
    }
    this->phase = this->phase + 1;
    return;
  }
  handle_unreachable("invalid phase",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/ReReloop.cpp"
                     ,200);
}

Assistant:

void run() override {
      if (phase == 0) {
        // end of ifTrue
        ifTrueEnd = parent.getCurrCFGBlock();
        auto* after = parent.startCFGBlock();
        // if condition was false, go after the ifTrue, to ifFalse or outside
        parent.addBranch(condition, after);
        if (!curr->ifFalse) {
          parent.addBranch(ifTrueEnd, after);
        }
        phase++;
      } else if (phase == 1) {
        // end if ifFalse
        auto* ifFalseEnd = parent.getCurrCFGBlock();
        auto* after = parent.startCFGBlock();
        parent.addBranch(ifTrueEnd, after);
        parent.addBranch(ifFalseEnd, after);
      } else {
        WASM_UNREACHABLE("invalid phase");
      }
    }